

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key_tests.cpp
# Opt level: O0

void __thiscall key_tests::bip340_test_vectors::test_method(bip340_test_vectors *this)

{
  span<const_unsigned_char,_18446744073709551615UL> bytes;
  Span<const_unsigned_char> vch;
  Span<const_unsigned_char> vch_00;
  Span<const_unsigned_char> vch_01;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  pend;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __last2;
  Span<const_unsigned_char> sigbytes;
  Span<const_unsigned_char> sigbytes_00;
  Span<const_unsigned_char> sigbytes_01;
  Span<const_unsigned_char> sigbytes_02;
  Span<const_unsigned_char> sigbytes_03;
  initializer_list<std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>_>
  __l;
  initializer_list<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>_>
  __l_00;
  Span<unsigned_char> sig_00;
  Span<unsigned_char> sig_01;
  string_view hex_str;
  string_view hex_str_00;
  string_view hex_str_01;
  string_view hex_str_02;
  string_view hex_str_03;
  string_view hex_str_04;
  string_view hex_str_05;
  string_view hex_str_06;
  Span<unsigned_char> sig_02;
  Span<unsigned_char> sig_03;
  bool bVar1;
  int iVar2;
  reference ppVar3;
  pair<XOnlyPubKey,_bool> *ppVar4;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffdce8;
  lazy_ostream *in_stack_ffffffffffffdcf0;
  char *in_stack_ffffffffffffdcf8;
  undefined7 in_stack_ffffffffffffdd00;
  undefined1 in_stack_ffffffffffffdd07;
  __extent_storage<18446744073709551615UL> in_stack_ffffffffffffdd08;
  undefined7 in_stack_ffffffffffffdd10;
  undefined1 in_stack_ffffffffffffdd17;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_ffffffffffffdd18;
  undefined7 in_stack_ffffffffffffdd20;
  undefined1 in_stack_ffffffffffffdd27;
  allocator<char> *in_stack_ffffffffffffdd28;
  undefined7 in_stack_ffffffffffffdd30;
  undefined1 in_stack_ffffffffffffdd37;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffdd38;
  allocator<char> *in_stack_ffffffffffffdd40;
  undefined6 in_stack_ffffffffffffdd48;
  undefined1 in_stack_ffffffffffffdd4e;
  undefined1 in_stack_ffffffffffffdd4f;
  lazy_ostream *in_stack_ffffffffffffdd50;
  undefined7 in_stack_ffffffffffffdd58;
  undefined1 in_stack_ffffffffffffdd5f;
  allocator<char> *in_stack_ffffffffffffdd60;
  undefined7 in_stack_ffffffffffffdd68;
  undefined1 in_stack_ffffffffffffdd6f;
  undefined1 *local_20d0;
  long *local_1e40;
  bool kp_ok_1;
  bool ok_1;
  int i;
  bool kp_ok;
  bool ok;
  type *sig_hex;
  type *msg_hex;
  type *aux_hex;
  type *pub_hex;
  type *sec_hex;
  vector<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>,_std::allocator<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>_>_>
  *__range1_1;
  pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>
  *test;
  vector<std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>,_std::allocator<std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>_>_>
  *__range1;
  bip340_test_vectors *this_local;
  const_string local_1878 [2];
  lazy_ostream local_1858 [3];
  assertion_result local_1828 [2];
  const_string local_17f0 [2];
  lazy_ostream local_17d0 [2];
  assertion_result local_17b0 [3];
  KeyPair keypair_1;
  const_string local_1760 [2];
  lazy_ostream local_1740 [3];
  assertion_result local_1710 [2];
  const_string local_16d8 [2];
  lazy_ostream local_16b8 [2];
  assertion_result local_1698 [3];
  const_string local_1650 [2];
  lazy_ostream local_1630 [2];
  assertion_result local_1610 [2];
  const_string local_15d8 [2];
  lazy_ostream local_15b8 [4];
  assertion_result local_1578 [2];
  const_string local_1540 [2];
  lazy_ostream local_1520 [3];
  assertion_result local_14f0 [2];
  const_string local_14b8 [2];
  lazy_ostream local_1498 [2];
  assertion_result local_1478 [3];
  KeyPair keypair;
  const_string local_1428 [2];
  lazy_ostream local_1408 [3];
  assertion_result local_13d8 [2];
  const_string local_13a0 [2];
  lazy_ostream local_1380 [4];
  assertion_result local_1340 [2];
  const_string local_1308 [2];
  lazy_ostream local_12e8 [2];
  assertion_result local_12c8 [3];
  const_string local_1280 [2];
  lazy_ostream local_1260 [2];
  assertion_result local_1240 [2];
  CKey key;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sig_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pub;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sec;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  allocator<char> local_114c;
  allocator<char> local_114b;
  allocator<char> local_114a;
  allocator<char> local_1149;
  allocator<char> local_1148;
  allocator<char> local_1147;
  allocator<char> local_1146;
  allocator<char> local_1145;
  allocator<char> local_1144;
  allocator<char> local_1143;
  allocator<char> local_1142;
  allocator<char> local_1141;
  allocator<char> local_1140;
  allocator<char> local_113f;
  allocator<char> local_113e;
  allocator<char> local_113d;
  allocator<char> local_113c;
  allocator<char> local_113b;
  allocator<char> local_113a;
  allocator<char> local_1139 [56];
  undefined1 local_1101;
  undefined1 local_1100 [16];
  undefined1 local_10f0 [64];
  vector<unsigned_char,_std::allocator<unsigned_char>_> sig;
  vector<unsigned_char,_std::allocator<unsigned_char>_> msg;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pubkey;
  const_iterator __end1;
  const_iterator __begin1;
  allocator<char> local_1053;
  allocator<char> local_1052;
  allocator<char> local_1051;
  undefined1 local_1050;
  allocator<char> local_104f;
  allocator<char> local_104e;
  allocator<char> local_104d;
  undefined1 local_104c;
  allocator<char> local_104b;
  allocator<char> local_104a;
  allocator<char> local_1049;
  undefined1 local_1048;
  allocator<char> local_1047;
  allocator<char> local_1046;
  allocator<char> local_1045;
  undefined1 local_1044;
  allocator<char> local_1043;
  allocator<char> local_1042;
  allocator<char> local_1041;
  undefined1 local_1040;
  allocator<char> local_103f;
  allocator<char> local_103e;
  allocator<char> local_103d;
  undefined1 local_103c;
  allocator<char> local_103b;
  allocator<char> local_103a;
  allocator<char> local_1039;
  undefined1 local_1038;
  allocator<char> local_1037;
  allocator<char> local_1036;
  allocator<char> local_1035;
  undefined1 local_1034;
  allocator<char> local_1033;
  allocator<char> local_1032;
  allocator<char> local_1031;
  undefined1 local_1030;
  allocator<char> local_102f;
  allocator<char> local_102e;
  allocator<char> local_102d;
  undefined1 local_102c;
  allocator<char> local_102b;
  allocator<char> local_102a;
  allocator<char> local_1029;
  undefined1 local_1028;
  allocator<char> local_1027;
  allocator<char> local_1026;
  allocator<char> local_1025;
  undefined1 local_1024;
  allocator<char> local_1023;
  allocator<char> local_1022;
  allocator<char> local_1021;
  undefined1 local_1020;
  allocator<char> local_101f;
  allocator<char> local_101e;
  allocator<char> local_101d;
  undefined1 local_101c;
  allocator<char> local_101b;
  allocator<char> local_101a;
  allocator<char> local_1019 [25];
  undefined8 uStack_1000;
  XOnlyPubKey tweaked_key;
  optional<std::pair<XOnlyPubKey,_bool>_> tweaked;
  uint256 merkle_root;
  XOnlyPubKey pubkey_1;
  uchar sig64 [64];
  uint256 msg256;
  uint256 aux256;
  undefined1 local_e80 [640];
  undefined1 local_c00 [1504];
  long local_620 [195];
  long local_8;
  
  uStack_1000 = 0;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((test_method()::VECTORS_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&test_method()::VECTORS_abi_cxx11_), iVar2 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdd38,
               (char *)CONCAT17(in_stack_ffffffffffffdd37,in_stack_ffffffffffffdd30),
               in_stack_ffffffffffffdd28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdd38,
               (char *)CONCAT17(in_stack_ffffffffffffdd37,in_stack_ffffffffffffdd30),
               in_stack_ffffffffffffdd28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdd38,
               (char *)CONCAT17(in_stack_ffffffffffffdd37,in_stack_ffffffffffffdd30),
               in_stack_ffffffffffffdd28);
    local_101c = 1;
    std::
    pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>
    ::pair<bool,_true>((pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>
                        *)in_stack_ffffffffffffdcf8,
                       (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
                        *)in_stack_ffffffffffffdcf0,(bool *)in_stack_ffffffffffffdce8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdd38,
               (char *)CONCAT17(in_stack_ffffffffffffdd37,in_stack_ffffffffffffdd30),
               in_stack_ffffffffffffdd28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdd38,
               (char *)CONCAT17(in_stack_ffffffffffffdd37,in_stack_ffffffffffffdd30),
               in_stack_ffffffffffffdd28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdd38,
               (char *)CONCAT17(in_stack_ffffffffffffdd37,in_stack_ffffffffffffdd30),
               in_stack_ffffffffffffdd28);
    local_1020 = 1;
    std::
    pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>
    ::pair<bool,_true>((pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>
                        *)in_stack_ffffffffffffdcf8,
                       (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
                        *)in_stack_ffffffffffffdcf0,(bool *)in_stack_ffffffffffffdce8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdd38,
               (char *)CONCAT17(in_stack_ffffffffffffdd37,in_stack_ffffffffffffdd30),
               in_stack_ffffffffffffdd28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdd38,
               (char *)CONCAT17(in_stack_ffffffffffffdd37,in_stack_ffffffffffffdd30),
               in_stack_ffffffffffffdd28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdd38,
               (char *)CONCAT17(in_stack_ffffffffffffdd37,in_stack_ffffffffffffdd30),
               in_stack_ffffffffffffdd28);
    local_1024 = 1;
    std::
    pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>
    ::pair<bool,_true>((pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>
                        *)in_stack_ffffffffffffdcf8,
                       (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
                        *)in_stack_ffffffffffffdcf0,(bool *)in_stack_ffffffffffffdce8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdd38,
               (char *)CONCAT17(in_stack_ffffffffffffdd37,in_stack_ffffffffffffdd30),
               in_stack_ffffffffffffdd28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdd38,
               (char *)CONCAT17(in_stack_ffffffffffffdd37,in_stack_ffffffffffffdd30),
               in_stack_ffffffffffffdd28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdd38,
               (char *)CONCAT17(in_stack_ffffffffffffdd37,in_stack_ffffffffffffdd30),
               in_stack_ffffffffffffdd28);
    local_1028 = 1;
    std::
    pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>
    ::pair<bool,_true>((pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>
                        *)in_stack_ffffffffffffdcf8,
                       (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
                        *)in_stack_ffffffffffffdcf0,(bool *)in_stack_ffffffffffffdce8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdd38,
               (char *)CONCAT17(in_stack_ffffffffffffdd37,in_stack_ffffffffffffdd30),
               in_stack_ffffffffffffdd28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdd38,
               (char *)CONCAT17(in_stack_ffffffffffffdd37,in_stack_ffffffffffffdd30),
               in_stack_ffffffffffffdd28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdd38,
               (char *)CONCAT17(in_stack_ffffffffffffdd37,in_stack_ffffffffffffdd30),
               in_stack_ffffffffffffdd28);
    local_102c = 1;
    std::
    pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>
    ::pair<bool,_true>((pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>
                        *)in_stack_ffffffffffffdcf8,
                       (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
                        *)in_stack_ffffffffffffdcf0,(bool *)in_stack_ffffffffffffdce8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdd38,
               (char *)CONCAT17(in_stack_ffffffffffffdd37,in_stack_ffffffffffffdd30),
               in_stack_ffffffffffffdd28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdd38,
               (char *)CONCAT17(in_stack_ffffffffffffdd37,in_stack_ffffffffffffdd30),
               in_stack_ffffffffffffdd28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdd38,
               (char *)CONCAT17(in_stack_ffffffffffffdd37,in_stack_ffffffffffffdd30),
               in_stack_ffffffffffffdd28);
    local_1030 = 0;
    std::
    pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>
    ::pair<bool,_true>((pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>
                        *)in_stack_ffffffffffffdcf8,
                       (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
                        *)in_stack_ffffffffffffdcf0,(bool *)in_stack_ffffffffffffdce8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdd38,
               (char *)CONCAT17(in_stack_ffffffffffffdd37,in_stack_ffffffffffffdd30),
               in_stack_ffffffffffffdd28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdd38,
               (char *)CONCAT17(in_stack_ffffffffffffdd37,in_stack_ffffffffffffdd30),
               in_stack_ffffffffffffdd28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdd38,
               (char *)CONCAT17(in_stack_ffffffffffffdd37,in_stack_ffffffffffffdd30),
               in_stack_ffffffffffffdd28);
    local_1034 = 0;
    std::
    pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>
    ::pair<bool,_true>((pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>
                        *)in_stack_ffffffffffffdcf8,
                       (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
                        *)in_stack_ffffffffffffdcf0,(bool *)in_stack_ffffffffffffdce8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdd38,
               (char *)CONCAT17(in_stack_ffffffffffffdd37,in_stack_ffffffffffffdd30),
               in_stack_ffffffffffffdd28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdd38,
               (char *)CONCAT17(in_stack_ffffffffffffdd37,in_stack_ffffffffffffdd30),
               in_stack_ffffffffffffdd28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdd38,
               (char *)CONCAT17(in_stack_ffffffffffffdd37,in_stack_ffffffffffffdd30),
               in_stack_ffffffffffffdd28);
    local_1038 = 0;
    std::
    pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>
    ::pair<bool,_true>((pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>
                        *)in_stack_ffffffffffffdcf8,
                       (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
                        *)in_stack_ffffffffffffdcf0,(bool *)in_stack_ffffffffffffdce8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdd38,
               (char *)CONCAT17(in_stack_ffffffffffffdd37,in_stack_ffffffffffffdd30),
               in_stack_ffffffffffffdd28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdd38,
               (char *)CONCAT17(in_stack_ffffffffffffdd37,in_stack_ffffffffffffdd30),
               in_stack_ffffffffffffdd28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdd38,
               (char *)CONCAT17(in_stack_ffffffffffffdd37,in_stack_ffffffffffffdd30),
               in_stack_ffffffffffffdd28);
    local_103c = 0;
    std::
    pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>
    ::pair<bool,_true>((pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>
                        *)in_stack_ffffffffffffdcf8,
                       (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
                        *)in_stack_ffffffffffffdcf0,(bool *)in_stack_ffffffffffffdce8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdd38,
               (char *)CONCAT17(in_stack_ffffffffffffdd37,in_stack_ffffffffffffdd30),
               in_stack_ffffffffffffdd28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdd38,
               (char *)CONCAT17(in_stack_ffffffffffffdd37,in_stack_ffffffffffffdd30),
               in_stack_ffffffffffffdd28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdd38,
               (char *)CONCAT17(in_stack_ffffffffffffdd37,in_stack_ffffffffffffdd30),
               in_stack_ffffffffffffdd28);
    local_1040 = 0;
    std::
    pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>
    ::pair<bool,_true>((pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>
                        *)in_stack_ffffffffffffdcf8,
                       (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
                        *)in_stack_ffffffffffffdcf0,(bool *)in_stack_ffffffffffffdce8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdd38,
               (char *)CONCAT17(in_stack_ffffffffffffdd37,in_stack_ffffffffffffdd30),
               in_stack_ffffffffffffdd28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdd38,
               (char *)CONCAT17(in_stack_ffffffffffffdd37,in_stack_ffffffffffffdd30),
               in_stack_ffffffffffffdd28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdd38,
               (char *)CONCAT17(in_stack_ffffffffffffdd37,in_stack_ffffffffffffdd30),
               in_stack_ffffffffffffdd28);
    local_1044 = 0;
    std::
    pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>
    ::pair<bool,_true>((pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>
                        *)in_stack_ffffffffffffdcf8,
                       (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
                        *)in_stack_ffffffffffffdcf0,(bool *)in_stack_ffffffffffffdce8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdd38,
               (char *)CONCAT17(in_stack_ffffffffffffdd37,in_stack_ffffffffffffdd30),
               in_stack_ffffffffffffdd28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdd38,
               (char *)CONCAT17(in_stack_ffffffffffffdd37,in_stack_ffffffffffffdd30),
               in_stack_ffffffffffffdd28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdd38,
               (char *)CONCAT17(in_stack_ffffffffffffdd37,in_stack_ffffffffffffdd30),
               in_stack_ffffffffffffdd28);
    local_1048 = 0;
    std::
    pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>
    ::pair<bool,_true>((pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>
                        *)in_stack_ffffffffffffdcf8,
                       (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
                        *)in_stack_ffffffffffffdcf0,(bool *)in_stack_ffffffffffffdce8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdd38,
               (char *)CONCAT17(in_stack_ffffffffffffdd37,in_stack_ffffffffffffdd30),
               in_stack_ffffffffffffdd28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdd38,
               (char *)CONCAT17(in_stack_ffffffffffffdd37,in_stack_ffffffffffffdd30),
               in_stack_ffffffffffffdd28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdd38,
               (char *)CONCAT17(in_stack_ffffffffffffdd37,in_stack_ffffffffffffdd30),
               in_stack_ffffffffffffdd28);
    local_104c = 0;
    std::
    pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>
    ::pair<bool,_true>((pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>
                        *)in_stack_ffffffffffffdcf8,
                       (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
                        *)in_stack_ffffffffffffdcf0,(bool *)in_stack_ffffffffffffdce8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdd38,
               (char *)CONCAT17(in_stack_ffffffffffffdd37,in_stack_ffffffffffffdd30),
               in_stack_ffffffffffffdd28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdd38,
               (char *)CONCAT17(in_stack_ffffffffffffdd37,in_stack_ffffffffffffdd30),
               in_stack_ffffffffffffdd28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdd38,
               (char *)CONCAT17(in_stack_ffffffffffffdd37,in_stack_ffffffffffffdd30),
               in_stack_ffffffffffffdd28);
    local_1050 = 0;
    std::
    pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>
    ::pair<bool,_true>((pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>
                        *)in_stack_ffffffffffffdcf8,
                       (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
                        *)in_stack_ffffffffffffdcf0,(bool *)in_stack_ffffffffffffdce8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdd38,
               (char *)CONCAT17(in_stack_ffffffffffffdd37,in_stack_ffffffffffffdd30),
               in_stack_ffffffffffffdd28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdd38,
               (char *)CONCAT17(in_stack_ffffffffffffdd37,in_stack_ffffffffffffdd30),
               in_stack_ffffffffffffdd28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdd38,
               (char *)CONCAT17(in_stack_ffffffffffffdd37,in_stack_ffffffffffffdd30),
               in_stack_ffffffffffffdd28);
    std::
    pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>
    ::pair<bool,_true>((pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>
                        *)in_stack_ffffffffffffdcf8,
                       (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
                        *)in_stack_ffffffffffffdcf0,(bool *)in_stack_ffffffffffffdce8);
    std::
    allocator<std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>_>
    ::allocator((allocator<std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>_>
                 *)in_stack_ffffffffffffdce8);
    __l._M_array._7_1_ = in_stack_ffffffffffffdd37;
    __l._M_array._0_7_ = in_stack_ffffffffffffdd30;
    __l._M_len = (size_type)in_stack_ffffffffffffdd38;
    std::
    vector<std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>,_std::allocator<std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>_>_>
    ::vector((vector<std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>,_std::allocator<std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>_>_>
              *)in_stack_ffffffffffffdd28,__l,
             (allocator_type *)CONCAT17(in_stack_ffffffffffffdd27,in_stack_ffffffffffffdd20));
    std::
    allocator<std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>_>
    ::~allocator((allocator<std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>_>
                  *)in_stack_ffffffffffffdce8);
    local_1e40 = &local_8;
    do {
      local_1e40 = local_1e40 + -0xd;
      std::
      pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>
      ::~pair((pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>
               *)in_stack_ffffffffffffdce8);
    } while (local_1e40 != local_620);
    std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
    ::~array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
              *)in_stack_ffffffffffffdcf8);
    std::allocator<char>::~allocator(&local_1053);
    std::allocator<char>::~allocator(&local_1052);
    std::allocator<char>::~allocator(&local_1051);
    std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
    ::~array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
              *)in_stack_ffffffffffffdcf8);
    std::allocator<char>::~allocator(&local_104f);
    std::allocator<char>::~allocator(&local_104e);
    std::allocator<char>::~allocator(&local_104d);
    std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
    ::~array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
              *)in_stack_ffffffffffffdcf8);
    std::allocator<char>::~allocator(&local_104b);
    std::allocator<char>::~allocator(&local_104a);
    std::allocator<char>::~allocator(&local_1049);
    std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
    ::~array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
              *)in_stack_ffffffffffffdcf8);
    std::allocator<char>::~allocator(&local_1047);
    std::allocator<char>::~allocator(&local_1046);
    std::allocator<char>::~allocator(&local_1045);
    std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
    ::~array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
              *)in_stack_ffffffffffffdcf8);
    std::allocator<char>::~allocator(&local_1043);
    std::allocator<char>::~allocator(&local_1042);
    std::allocator<char>::~allocator(&local_1041);
    std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
    ::~array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
              *)in_stack_ffffffffffffdcf8);
    std::allocator<char>::~allocator(&local_103f);
    std::allocator<char>::~allocator(&local_103e);
    std::allocator<char>::~allocator(&local_103d);
    std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
    ::~array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
              *)in_stack_ffffffffffffdcf8);
    std::allocator<char>::~allocator(&local_103b);
    std::allocator<char>::~allocator(&local_103a);
    std::allocator<char>::~allocator(&local_1039);
    std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
    ::~array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
              *)in_stack_ffffffffffffdcf8);
    std::allocator<char>::~allocator(&local_1037);
    std::allocator<char>::~allocator(&local_1036);
    std::allocator<char>::~allocator(&local_1035);
    std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
    ::~array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
              *)in_stack_ffffffffffffdcf8);
    std::allocator<char>::~allocator(&local_1033);
    std::allocator<char>::~allocator(&local_1032);
    std::allocator<char>::~allocator(&local_1031);
    std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
    ::~array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
              *)in_stack_ffffffffffffdcf8);
    std::allocator<char>::~allocator(&local_102f);
    std::allocator<char>::~allocator(&local_102e);
    std::allocator<char>::~allocator(&local_102d);
    std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
    ::~array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
              *)in_stack_ffffffffffffdcf8);
    std::allocator<char>::~allocator(&local_102b);
    std::allocator<char>::~allocator(&local_102a);
    std::allocator<char>::~allocator(&local_1029);
    std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
    ::~array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
              *)in_stack_ffffffffffffdcf8);
    std::allocator<char>::~allocator(&local_1027);
    std::allocator<char>::~allocator(&local_1026);
    std::allocator<char>::~allocator(&local_1025);
    std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
    ::~array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
              *)in_stack_ffffffffffffdcf8);
    std::allocator<char>::~allocator(&local_1023);
    std::allocator<char>::~allocator(&local_1022);
    std::allocator<char>::~allocator(&local_1021);
    std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
    ::~array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
              *)in_stack_ffffffffffffdcf8);
    std::allocator<char>::~allocator(&local_101f);
    std::allocator<char>::~allocator(&local_101e);
    std::allocator<char>::~allocator(&local_101d);
    std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
    ::~array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
              *)in_stack_ffffffffffffdcf8);
    std::allocator<char>::~allocator(&local_101b);
    std::allocator<char>::~allocator(&local_101a);
    std::allocator<char>::~allocator(local_1019);
    __cxa_atexit(std::
                 vector<std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>,_std::allocator<std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>_>_>
                 ::~vector,&test_method()::VECTORS_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&test_method()::VECTORS_abi_cxx11_);
  }
  std::
  vector<std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>,_std::allocator<std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>_>_>
  ::begin((vector<std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>,_std::allocator<std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>_>_>
           *)in_stack_ffffffffffffdcf0);
  std::
  vector<std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>,_std::allocator<std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>_>_>
  ::end((vector<std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>,_std::allocator<std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>_>_>
         *)in_stack_ffffffffffffdcf0);
  while (bVar1 = __gnu_cxx::
                 operator==<const_std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>_*,_std::vector<std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>,_std::allocator<std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>_>_>_>
                           ((__normal_iterator<const_std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>_*,_std::vector<std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>,_std::allocator<std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>_>_>_>
                             *)in_stack_ffffffffffffdcf8,
                            (__normal_iterator<const_std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>_*,_std::vector<std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>,_std::allocator<std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>_>_>_>
                             *)in_stack_ffffffffffffdcf0), ((bVar1 ^ 0xffU) & 1) != 0) {
    ppVar3 = __gnu_cxx::
             __normal_iterator<const_std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>_*,_std::vector<std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>,_std::allocator<std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>_>_>_>
             ::operator*((__normal_iterator<const_std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>_*,_std::vector<std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>,_std::allocator<std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>_>_>_>
                          *)in_stack_ffffffffffffdce8);
    std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
    ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
                  *)in_stack_ffffffffffffdcf8,(size_type)in_stack_ffffffffffffdcf0);
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffdd08._M_extent_value);
    hex_str._M_str._0_7_ = in_stack_ffffffffffffdd58;
    hex_str._M_len = (size_t)in_stack_ffffffffffffdd50;
    hex_str._M_str._7_1_ = in_stack_ffffffffffffdd5f;
    ParseHex<unsigned_char>(hex_str);
    std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
    ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
                  *)in_stack_ffffffffffffdcf8,(size_type)in_stack_ffffffffffffdcf0);
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffdd08._M_extent_value);
    hex_str_00._M_str._0_7_ = in_stack_ffffffffffffdd58;
    hex_str_00._M_len = (size_t)in_stack_ffffffffffffdd50;
    hex_str_00._M_str._7_1_ = in_stack_ffffffffffffdd5f;
    ParseHex<unsigned_char>(hex_str_00);
    std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
    ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
                  *)in_stack_ffffffffffffdcf8,(size_type)in_stack_ffffffffffffdcf0);
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffdd08._M_extent_value);
    hex_str_01._M_str._0_7_ = in_stack_ffffffffffffdd58;
    hex_str_01._M_len = (size_t)in_stack_ffffffffffffdd50;
    hex_str_01._M_str._7_1_ = in_stack_ffffffffffffdd5f;
    ParseHex<unsigned_char>(hex_str_01);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffdcf8,
                 (pointer)in_stack_ffffffffffffdcf0,(unsigned_long)in_stack_ffffffffffffdce8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffdce8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffdd28,
                 (const_string *)CONCAT17(in_stack_ffffffffffffdd27,in_stack_ffffffffffffdd20),
                 (size_t)in_stack_ffffffffffffdd18._M_current,
                 (const_string *)CONCAT17(in_stack_ffffffffffffdd17,in_stack_ffffffffffffdd10));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                (in_stack_ffffffffffffdcf0,(char (*) [1])in_stack_ffffffffffffdce8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffdcf8,
                 (pointer)in_stack_ffffffffffffdcf0,(unsigned_long)in_stack_ffffffffffffdce8);
      std::span<const_unsigned_char,_18446744073709551615UL>::
      span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>
                ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_ffffffffffffdcf8,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffdcf0)
      ;
      bytes._M_ptr._7_1_ = in_stack_ffffffffffffdd07;
      bytes._M_ptr._0_7_ = in_stack_ffffffffffffdd00;
      bytes._M_extent._M_extent_value = in_stack_ffffffffffffdd08._M_extent_value;
      XOnlyPubKey::XOnlyPubKey((XOnlyPubKey *)in_stack_ffffffffffffdce8,bytes);
      Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ((Span<const_unsigned_char> *)in_stack_ffffffffffffdcf8,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffdcf0,
                 in_stack_ffffffffffffdce8);
      vch.m_data._7_1_ = in_stack_ffffffffffffdd07;
      vch.m_data._0_7_ = in_stack_ffffffffffffdd00;
      vch.m_size = in_stack_ffffffffffffdd08._M_extent_value;
      uint256::uint256((uint256 *)in_stack_ffffffffffffdce8,vch);
      Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ((Span<const_unsigned_char> *)in_stack_ffffffffffffdcf8,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffdcf0,
                 in_stack_ffffffffffffdce8);
      sigbytes.m_data._7_1_ = in_stack_ffffffffffffdd27;
      sigbytes.m_data._0_7_ = in_stack_ffffffffffffdd20;
      sigbytes.m_size = (size_t)in_stack_ffffffffffffdd28;
      local_1101 = XOnlyPubKey::VerifySchnorr
                             ((XOnlyPubKey *)
                              CONCAT17(in_stack_ffffffffffffdd17,in_stack_ffffffffffffdd10),
                              (uint256 *)in_stack_ffffffffffffdd08._M_extent_value,sigbytes);
      in_stack_ffffffffffffdcf0 = (lazy_ostream *)&ppVar3->second;
      in_stack_ffffffffffffdcf8 = "test.second";
      in_stack_ffffffffffffdce8 = "XOnlyPubKey(pubkey).VerifySchnorr(uint256(msg), sig)";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
                (local_10f0,local_1100,0x116,1,2,&local_1101);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_ffffffffffffdce8);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffdcf8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffdcf8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffdcf8);
    __gnu_cxx::
    __normal_iterator<const_std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>_*,_std::vector<std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>,_std::allocator<std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>_>_>_>
    ::operator++((__normal_iterator<const_std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>_*,_std::vector<std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>,_std::allocator<std::pair<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>,_bool>_>_>_>
                  *)in_stack_ffffffffffffdce8);
  }
  if ((test_method()::SIGN_VECTORS_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&test_method()::SIGN_VECTORS_abi_cxx11_), iVar2 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdd38,
               (char *)CONCAT17(in_stack_ffffffffffffdd37,in_stack_ffffffffffffdd30),
               in_stack_ffffffffffffdd28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdd38,
               (char *)CONCAT17(in_stack_ffffffffffffdd37,in_stack_ffffffffffffdd30),
               in_stack_ffffffffffffdd28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdd38,
               (char *)CONCAT17(in_stack_ffffffffffffdd37,in_stack_ffffffffffffdd30),
               in_stack_ffffffffffffdd28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdd38,
               (char *)CONCAT17(in_stack_ffffffffffffdd37,in_stack_ffffffffffffdd30),
               in_stack_ffffffffffffdd28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdd38,
               (char *)CONCAT17(in_stack_ffffffffffffdd37,in_stack_ffffffffffffdd30),
               in_stack_ffffffffffffdd28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdd38,
               (char *)CONCAT17(in_stack_ffffffffffffdd37,in_stack_ffffffffffffdd30),
               in_stack_ffffffffffffdd28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdd38,
               (char *)CONCAT17(in_stack_ffffffffffffdd37,in_stack_ffffffffffffdd30),
               in_stack_ffffffffffffdd28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdd38,
               (char *)CONCAT17(in_stack_ffffffffffffdd37,in_stack_ffffffffffffdd30),
               in_stack_ffffffffffffdd28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdd38,
               (char *)CONCAT17(in_stack_ffffffffffffdd37,in_stack_ffffffffffffdd30),
               in_stack_ffffffffffffdd28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdd38,
               (char *)CONCAT17(in_stack_ffffffffffffdd37,in_stack_ffffffffffffdd30),
               in_stack_ffffffffffffdd28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdd38,
               (char *)CONCAT17(in_stack_ffffffffffffdd37,in_stack_ffffffffffffdd30),
               in_stack_ffffffffffffdd28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdd38,
               (char *)CONCAT17(in_stack_ffffffffffffdd37,in_stack_ffffffffffffdd30),
               in_stack_ffffffffffffdd28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdd38,
               (char *)CONCAT17(in_stack_ffffffffffffdd37,in_stack_ffffffffffffdd30),
               in_stack_ffffffffffffdd28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdd38,
               (char *)CONCAT17(in_stack_ffffffffffffdd37,in_stack_ffffffffffffdd30),
               in_stack_ffffffffffffdd28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdd38,
               (char *)CONCAT17(in_stack_ffffffffffffdd37,in_stack_ffffffffffffdd30),
               in_stack_ffffffffffffdd28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdd38,
               (char *)CONCAT17(in_stack_ffffffffffffdd37,in_stack_ffffffffffffdd30),
               in_stack_ffffffffffffdd28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdd38,
               (char *)CONCAT17(in_stack_ffffffffffffdd37,in_stack_ffffffffffffdd30),
               in_stack_ffffffffffffdd28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdd38,
               (char *)CONCAT17(in_stack_ffffffffffffdd37,in_stack_ffffffffffffdd30),
               in_stack_ffffffffffffdd28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdd38,
               (char *)CONCAT17(in_stack_ffffffffffffdd37,in_stack_ffffffffffffdd30),
               in_stack_ffffffffffffdd28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffdd38,
               (char *)CONCAT17(in_stack_ffffffffffffdd37,in_stack_ffffffffffffdd30),
               in_stack_ffffffffffffdd28);
    std::
    allocator<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>_>
    ::allocator((allocator<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>_>
                 *)in_stack_ffffffffffffdce8);
    __l_00._M_array._7_1_ = in_stack_ffffffffffffdd37;
    __l_00._M_array._0_7_ = in_stack_ffffffffffffdd30;
    __l_00._M_len = (size_type)in_stack_ffffffffffffdd38;
    std::
    vector<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>,_std::allocator<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>_>_>
    ::vector((vector<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>,_std::allocator<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>_>_>
              *)in_stack_ffffffffffffdd28,__l_00,
             (allocator_type *)CONCAT17(in_stack_ffffffffffffdd27,in_stack_ffffffffffffdd20));
    std::
    allocator<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>_>
    ::~allocator((allocator<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>_>
                  *)in_stack_ffffffffffffdce8);
    local_20d0 = local_c00;
    do {
      local_20d0 = local_20d0 + -0xa0;
      std::
      array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>::
      ~array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>
              *)in_stack_ffffffffffffdcf8);
    } while (local_20d0 != local_e80);
    std::allocator<char>::~allocator(&local_114c);
    std::allocator<char>::~allocator(&local_114b);
    std::allocator<char>::~allocator(&local_114a);
    std::allocator<char>::~allocator(&local_1149);
    std::allocator<char>::~allocator(&local_1148);
    std::allocator<char>::~allocator(&local_1147);
    std::allocator<char>::~allocator(&local_1146);
    std::allocator<char>::~allocator(&local_1145);
    std::allocator<char>::~allocator(&local_1144);
    std::allocator<char>::~allocator(&local_1143);
    std::allocator<char>::~allocator(&local_1142);
    std::allocator<char>::~allocator(&local_1141);
    std::allocator<char>::~allocator(&local_1140);
    std::allocator<char>::~allocator(&local_113f);
    std::allocator<char>::~allocator(&local_113e);
    std::allocator<char>::~allocator(&local_113d);
    std::allocator<char>::~allocator(&local_113c);
    std::allocator<char>::~allocator(&local_113b);
    std::allocator<char>::~allocator(&local_113a);
    std::allocator<char>::~allocator(local_1139);
    __cxa_atexit(std::
                 vector<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>,_std::allocator<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>_>_>
                 ::~vector,&test_method()::SIGN_VECTORS_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&test_method()::SIGN_VECTORS_abi_cxx11_);
  }
  std::
  vector<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>,_std::allocator<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>_>_>
  ::begin((vector<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>,_std::allocator<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>_>_>
           *)in_stack_ffffffffffffdcf0);
  std::
  vector<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>,_std::allocator<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>_>_>
  ::end((vector<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>,_std::allocator<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>_>_>
         *)in_stack_ffffffffffffdcf0);
  while (bVar1 = __gnu_cxx::
                 operator==<const_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>_*,_std::vector<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>,_std::allocator<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>_>_>_>
                           ((__normal_iterator<const_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>_*,_std::vector<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>,_std::allocator<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>_>_>_>
                             *)in_stack_ffffffffffffdcf8,
                            (__normal_iterator<const_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>_*,_std::vector<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>,_std::allocator<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>_>_>_>
                             *)in_stack_ffffffffffffdcf0), ((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<const_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>_*,_std::vector<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>,_std::allocator<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>_>_>_>
    ::operator*((__normal_iterator<const_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>_*,_std::vector<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>,_std::allocator<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>_>_>_>
                 *)in_stack_ffffffffffffdce8);
    std::get<0ul,std::__cxx11::string,5ul>
              ((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>
                *)in_stack_ffffffffffffdce8);
    std::get<1ul,std::__cxx11::string,5ul>
              ((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>
                *)in_stack_ffffffffffffdce8);
    std::get<2ul,std::__cxx11::string,5ul>
              ((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>
                *)in_stack_ffffffffffffdce8);
    std::get<3ul,std::__cxx11::string,5ul>
              ((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>
                *)in_stack_ffffffffffffdce8);
    std::get<4ul,std::__cxx11::string,5ul>
              ((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>
                *)in_stack_ffffffffffffdce8);
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffdd08._M_extent_value);
    hex_str_02._M_str._0_7_ = in_stack_ffffffffffffdd58;
    hex_str_02._M_len = (size_t)in_stack_ffffffffffffdd50;
    hex_str_02._M_str._7_1_ = in_stack_ffffffffffffdd5f;
    ParseHex<unsigned_char>(hex_str_02);
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffdd08._M_extent_value);
    hex_str_03._M_str._0_7_ = in_stack_ffffffffffffdd58;
    hex_str_03._M_len = (size_t)in_stack_ffffffffffffdd50;
    hex_str_03._M_str._7_1_ = in_stack_ffffffffffffdd5f;
    ParseHex<unsigned_char>(hex_str_03);
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffdd08._M_extent_value);
    hex_str_04._M_str._0_7_ = in_stack_ffffffffffffdd58;
    hex_str_04._M_len = (size_t)in_stack_ffffffffffffdd50;
    hex_str_04._M_str._7_1_ = in_stack_ffffffffffffdd5f;
    ParseHex<unsigned_char>(hex_str_04);
    Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((Span<const_unsigned_char> *)in_stack_ffffffffffffdcf8,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffdcf0,
               in_stack_ffffffffffffdce8);
    vch_00.m_data._7_1_ = in_stack_ffffffffffffdd07;
    vch_00.m_data._0_7_ = in_stack_ffffffffffffdd00;
    vch_00.m_size = in_stack_ffffffffffffdd08._M_extent_value;
    uint256::uint256((uint256 *)in_stack_ffffffffffffdce8,vch_00);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffdcf8);
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffdd08._M_extent_value);
    hex_str_05._M_str._0_7_ = in_stack_ffffffffffffdd58;
    hex_str_05._M_len = (size_t)in_stack_ffffffffffffdd50;
    hex_str_05._M_str._7_1_ = in_stack_ffffffffffffdd5f;
    ParseHex<unsigned_char>(hex_str_05);
    Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((Span<const_unsigned_char> *)in_stack_ffffffffffffdcf8,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffdcf0,
               in_stack_ffffffffffffdce8);
    vch_01.m_data._7_1_ = in_stack_ffffffffffffdd07;
    vch_01.m_data._0_7_ = in_stack_ffffffffffffdd00;
    vch_01.m_size = in_stack_ffffffffffffdd08._M_extent_value;
    uint256::uint256((uint256 *)in_stack_ffffffffffffdce8,vch_01);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffdcf8);
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffdd08._M_extent_value);
    hex_str_06._M_str._0_7_ = in_stack_ffffffffffffdd58;
    hex_str_06._M_len = (size_t)in_stack_ffffffffffffdd50;
    hex_str_06._M_str._7_1_ = in_stack_ffffffffffffdd5f;
    ParseHex<unsigned_char>(hex_str_06);
    CKey::CKey((CKey *)in_stack_ffffffffffffdce8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffdcf0);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffdcf0);
    pend._M_current._7_1_ = in_stack_ffffffffffffdd17;
    pend._M_current._0_7_ = in_stack_ffffffffffffdd10;
    CKey::
    Set<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              ((CKey *)in_stack_ffffffffffffdd08._M_extent_value,in_stack_ffffffffffffdd18,pend,
               (bool)in_stack_ffffffffffffdd07);
    CKey::GetPubKey((CKey *)CONCAT17(in_stack_ffffffffffffdd17,in_stack_ffffffffffffdd10));
    XOnlyPubKey::XOnlyPubKey
              ((XOnlyPubKey *)in_stack_ffffffffffffdcf8,(CPubKey *)in_stack_ffffffffffffdcf0);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffdcf8,
                 (pointer)in_stack_ffffffffffffdcf0,(unsigned_long)in_stack_ffffffffffffdce8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffdce8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffdd28,
                 (const_string *)CONCAT17(in_stack_ffffffffffffdd27,in_stack_ffffffffffffdd20),
                 (size_t)in_stack_ffffffffffffdd18._M_current,
                 (const_string *)CONCAT17(in_stack_ffffffffffffdd17,in_stack_ffffffffffffdd10));
      XOnlyPubKey::begin((XOnlyPubKey *)in_stack_ffffffffffffdce8);
      XOnlyPubKey::end((XOnlyPubKey *)in_stack_ffffffffffffdce8);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffdcf0)
      ;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffdcf0)
      ;
      __last2._M_current._7_1_ = in_stack_ffffffffffffdd17;
      __last2._M_current._0_7_ = in_stack_ffffffffffffdd10;
      std::
      equal<unsigned_char*,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ((uchar *)in_stack_ffffffffffffdcf8,(uchar *)in_stack_ffffffffffffdcf0,
                 in_stack_ffffffffffffdd18,__last2);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffdcf8,
                 SUB81((ulong)in_stack_ffffffffffffdcf0 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffdcf8,
                 (pointer)in_stack_ffffffffffffdcf0,(unsigned_long)in_stack_ffffffffffffdce8);
      boost::unit_test::operator<<
                (in_stack_ffffffffffffdcf0,(basic_cstring<const_char> *)in_stack_ffffffffffffdce8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffdcf8,
                 (pointer)in_stack_ffffffffffffdcf0,(unsigned_long)in_stack_ffffffffffffdce8);
      in_stack_ffffffffffffdce8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_1240,local_1260,local_1280,300,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_ffffffffffffdce8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffdce8);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    Span<unsigned_char>::Span<64>
              ((Span<unsigned_char> *)in_stack_ffffffffffffdce8,(uchar (*) [64])0x6e37f6);
    sig_00.m_size._0_6_ = in_stack_ffffffffffffdd48;
    sig_00.m_data = (uchar *)in_stack_ffffffffffffdd40;
    sig_00.m_size._6_1_ = in_stack_ffffffffffffdd4e;
    sig_00.m_size._7_1_ = in_stack_ffffffffffffdd4f;
    CKey::SignSchnorr((CKey *)in_stack_ffffffffffffdd18._M_current,
                      (uint256 *)CONCAT17(in_stack_ffffffffffffdd17,in_stack_ffffffffffffdd10),
                      sig_00,(uint256 *)in_stack_ffffffffffffdd08._M_extent_value,
                      (uint256 *)CONCAT17(in_stack_ffffffffffffdd07,in_stack_ffffffffffffdd00));
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffdcf8,
                 (pointer)in_stack_ffffffffffffdcf0,(unsigned_long)in_stack_ffffffffffffdce8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffdce8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffdd28,
                 (const_string *)CONCAT17(in_stack_ffffffffffffdd27,in_stack_ffffffffffffdd20),
                 (size_t)in_stack_ffffffffffffdd18._M_current,
                 (const_string *)CONCAT17(in_stack_ffffffffffffdd17,in_stack_ffffffffffffdd10));
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffdcf8,
                 SUB81((ulong)in_stack_ffffffffffffdcf0 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffdcf8,
                 (pointer)in_stack_ffffffffffffdcf0,(unsigned_long)in_stack_ffffffffffffdce8);
      boost::unit_test::operator<<
                (in_stack_ffffffffffffdcf0,(basic_cstring<const_char> *)in_stack_ffffffffffffdce8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffdcf8,
                 (pointer)in_stack_ffffffffffffdcf0,(unsigned_long)in_stack_ffffffffffffdce8);
      in_stack_ffffffffffffdce8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_12c8,local_12e8,local_1308,0x12e,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_ffffffffffffdce8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffdce8);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffdcf8,
                 (pointer)in_stack_ffffffffffffdcf0,(unsigned_long)in_stack_ffffffffffffdce8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffdce8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffdd28,
                 (const_string *)CONCAT17(in_stack_ffffffffffffdd27,in_stack_ffffffffffffdd20),
                 (size_t)in_stack_ffffffffffffdd18._M_current,
                 (const_string *)CONCAT17(in_stack_ffffffffffffdd17,in_stack_ffffffffffffdd10));
      std::allocator<unsigned_char>::allocator
                ((allocator<unsigned_char> *)in_stack_ffffffffffffdce8);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT17(in_stack_ffffffffffffdd37,in_stack_ffffffffffffdd30),
                 (uchar *)in_stack_ffffffffffffdd38,(uchar *)in_stack_ffffffffffffdd28,
                 (allocator_type *)CONCAT17(in_stack_ffffffffffffdd27,in_stack_ffffffffffffdd20));
      std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      in_stack_ffffffffffffdd18._M_current,
                      (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      CONCAT17(in_stack_ffffffffffffdd17,in_stack_ffffffffffffdd10));
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffdcf8,
                 SUB81((ulong)in_stack_ffffffffffffdcf0 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffdcf8,
                 (pointer)in_stack_ffffffffffffdcf0,(unsigned_long)in_stack_ffffffffffffdce8);
      boost::unit_test::operator<<
                (in_stack_ffffffffffffdcf0,(basic_cstring<const_char> *)in_stack_ffffffffffffdce8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffdcf8,
                 (pointer)in_stack_ffffffffffffdcf0,(unsigned_long)in_stack_ffffffffffffdce8);
      in_stack_ffffffffffffdce8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_1340,local_1380,local_13a0,0x12f,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_ffffffffffffdce8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffdce8);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffdcf8)
      ;
      std::allocator<unsigned_char>::~allocator
                ((allocator<unsigned_char> *)in_stack_ffffffffffffdce8);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffdcf8,
                 (pointer)in_stack_ffffffffffffdcf0,(unsigned_long)in_stack_ffffffffffffdce8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffdce8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffdd28,
                 (const_string *)CONCAT17(in_stack_ffffffffffffdd27,in_stack_ffffffffffffdd20),
                 (size_t)in_stack_ffffffffffffdd18._M_current,
                 (const_string *)CONCAT17(in_stack_ffffffffffffdd17,in_stack_ffffffffffffdd10));
      Span<const_unsigned_char>::Span<64>
                ((Span<const_unsigned_char> *)in_stack_ffffffffffffdce8,(uchar (*) [64])0x6e3bd9);
      sigbytes_00.m_data._7_1_ = in_stack_ffffffffffffdd27;
      sigbytes_00.m_data._0_7_ = in_stack_ffffffffffffdd20;
      sigbytes_00.m_size = (size_t)in_stack_ffffffffffffdd28;
      XOnlyPubKey::VerifySchnorr
                ((XOnlyPubKey *)CONCAT17(in_stack_ffffffffffffdd17,in_stack_ffffffffffffdd10),
                 (uint256 *)in_stack_ffffffffffffdd08._M_extent_value,sigbytes_00);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffdcf8,
                 SUB81((ulong)in_stack_ffffffffffffdcf0 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffdcf8,
                 (pointer)in_stack_ffffffffffffdcf0,(unsigned_long)in_stack_ffffffffffffdce8);
      boost::unit_test::operator<<
                (in_stack_ffffffffffffdcf0,(basic_cstring<const_char> *)in_stack_ffffffffffffdce8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffdcf8,
                 (pointer)in_stack_ffffffffffffdcf0,(unsigned_long)in_stack_ffffffffffffdce8);
      in_stack_ffffffffffffdce8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_13d8,local_1408,local_1428,0x131,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_ffffffffffffdce8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffdce8);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    CKey::ComputeKeyPair((CKey *)in_stack_ffffffffffffdcf0,(uint256 *)in_stack_ffffffffffffdce8);
    Span<unsigned_char>::Span<64>
              ((Span<unsigned_char> *)in_stack_ffffffffffffdce8,(uchar (*) [64])0x6e3d2a);
    sig_02.m_size._0_7_ = in_stack_ffffffffffffdd68;
    sig_02.m_data = (uchar *)in_stack_ffffffffffffdd60;
    sig_02.m_size._7_1_ = in_stack_ffffffffffffdd6f;
    KeyPair::SignSchnorr
              ((KeyPair *)in_stack_ffffffffffffdd50,
               (uint256 *)
               CONCAT17(in_stack_ffffffffffffdd4f,
                        CONCAT16(in_stack_ffffffffffffdd4e,in_stack_ffffffffffffdd48)),sig_02,
               (uint256 *)in_stack_ffffffffffffdd40);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffdcf8,
                 (pointer)in_stack_ffffffffffffdcf0,(unsigned_long)in_stack_ffffffffffffdce8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffdce8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffdd28,
                 (const_string *)CONCAT17(in_stack_ffffffffffffdd27,in_stack_ffffffffffffdd20),
                 (size_t)in_stack_ffffffffffffdd18._M_current,
                 (const_string *)CONCAT17(in_stack_ffffffffffffdd17,in_stack_ffffffffffffdd10));
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffdcf8,
                 SUB81((ulong)in_stack_ffffffffffffdcf0 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffdcf8,
                 (pointer)in_stack_ffffffffffffdcf0,(unsigned_long)in_stack_ffffffffffffdce8);
      boost::unit_test::operator<<
                (in_stack_ffffffffffffdcf0,(basic_cstring<const_char> *)in_stack_ffffffffffffdce8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffdcf8,
                 (pointer)in_stack_ffffffffffffdcf0,(unsigned_long)in_stack_ffffffffffffdce8);
      in_stack_ffffffffffffdce8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_1478,local_1498,local_14b8,0x136,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_ffffffffffffdce8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffdce8);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffdcf8,
                 (pointer)in_stack_ffffffffffffdcf0,(unsigned_long)in_stack_ffffffffffffdce8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffdce8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffdd28,
                 (const_string *)CONCAT17(in_stack_ffffffffffffdd27,in_stack_ffffffffffffdd20),
                 (size_t)in_stack_ffffffffffffdd18._M_current,
                 (const_string *)CONCAT17(in_stack_ffffffffffffdd17,in_stack_ffffffffffffdd10));
      Span<const_unsigned_char>::Span<64>
                ((Span<const_unsigned_char> *)in_stack_ffffffffffffdce8,(uchar (*) [64])0x6e3f32);
      sigbytes_01.m_data._7_1_ = in_stack_ffffffffffffdd27;
      sigbytes_01.m_data._0_7_ = in_stack_ffffffffffffdd20;
      sigbytes_01.m_size = (size_t)in_stack_ffffffffffffdd28;
      XOnlyPubKey::VerifySchnorr
                ((XOnlyPubKey *)CONCAT17(in_stack_ffffffffffffdd17,in_stack_ffffffffffffdd10),
                 (uint256 *)in_stack_ffffffffffffdd08._M_extent_value,sigbytes_01);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffdcf8,
                 SUB81((ulong)in_stack_ffffffffffffdcf0 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffdcf8,
                 (pointer)in_stack_ffffffffffffdcf0,(unsigned_long)in_stack_ffffffffffffdce8);
      boost::unit_test::operator<<
                (in_stack_ffffffffffffdcf0,(basic_cstring<const_char> *)in_stack_ffffffffffffdce8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffdcf8,
                 (pointer)in_stack_ffffffffffffdcf0,(unsigned_long)in_stack_ffffffffffffdce8);
      in_stack_ffffffffffffdce8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_14f0,local_1520,local_1540,0x137,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_ffffffffffffdce8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffdce8);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffdcf8,
                 (pointer)in_stack_ffffffffffffdcf0,(unsigned_long)in_stack_ffffffffffffdce8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffdce8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_ffffffffffffdd28,
                 (const_string *)CONCAT17(in_stack_ffffffffffffdd27,in_stack_ffffffffffffdd20),
                 (size_t)in_stack_ffffffffffffdd18._M_current,
                 (const_string *)CONCAT17(in_stack_ffffffffffffdd17,in_stack_ffffffffffffdd10));
      std::allocator<unsigned_char>::allocator
                ((allocator<unsigned_char> *)in_stack_ffffffffffffdce8);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT17(in_stack_ffffffffffffdd37,in_stack_ffffffffffffdd30),
                 (uchar *)in_stack_ffffffffffffdd38,(uchar *)in_stack_ffffffffffffdd28,
                 (allocator_type *)CONCAT17(in_stack_ffffffffffffdd27,in_stack_ffffffffffffdd20));
      std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      in_stack_ffffffffffffdd18._M_current,
                      (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      CONCAT17(in_stack_ffffffffffffdd17,in_stack_ffffffffffffdd10));
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffdcf8,
                 SUB81((ulong)in_stack_ffffffffffffdcf0 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffdcf8,
                 (pointer)in_stack_ffffffffffffdcf0,(unsigned_long)in_stack_ffffffffffffdce8);
      boost::unit_test::operator<<
                (in_stack_ffffffffffffdcf0,(basic_cstring<const_char> *)in_stack_ffffffffffffdce8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffdcf8,
                 (pointer)in_stack_ffffffffffffdcf0,(unsigned_long)in_stack_ffffffffffffdce8);
      in_stack_ffffffffffffdce8 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_1578,local_15b8,local_15d8,0x138,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_ffffffffffffdce8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffdce8);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffdcf8)
      ;
      std::allocator<unsigned_char>::~allocator
                ((allocator<unsigned_char> *)in_stack_ffffffffffffdce8);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    for (i = 0; i < 10; i = i + 1) {
      uint256::uint256((uint256 *)in_stack_ffffffffffffdce8);
      if (i != 0) {
        RandomMixin<FastRandomContext>::rand256
                  ((RandomMixin<FastRandomContext> *)in_stack_ffffffffffffdd18._M_current);
      }
      XOnlyPubKey::CreateTapTweak
                ((XOnlyPubKey *)CONCAT17(in_stack_ffffffffffffdd37,in_stack_ffffffffffffdd30),
                 (uint256 *)in_stack_ffffffffffffdd28);
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffdcf8,
                   (pointer)in_stack_ffffffffffffdcf0,(unsigned_long)in_stack_ffffffffffffdce8);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffdce8);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)in_stack_ffffffffffffdd28,
                   (const_string *)CONCAT17(in_stack_ffffffffffffdd27,in_stack_ffffffffffffdd20),
                   (size_t)in_stack_ffffffffffffdd18._M_current,
                   (const_string *)CONCAT17(in_stack_ffffffffffffdd17,in_stack_ffffffffffffdd10));
        boost::test_tools::assertion_result::
        assertion_result<std::optional<std::pair<XOnlyPubKey,bool>>>
                  ((assertion_result *)in_stack_ffffffffffffdcf8,
                   (optional<std::pair<XOnlyPubKey,_bool>_> *)in_stack_ffffffffffffdcf0);
        boost::unit_test::lazy_ostream::instance();
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffdcf8,
                   (pointer)in_stack_ffffffffffffdcf0,(unsigned_long)in_stack_ffffffffffffdce8);
        boost::unit_test::operator<<
                  (in_stack_ffffffffffffdcf0,(basic_cstring<const_char> *)in_stack_ffffffffffffdce8)
        ;
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffdcf8,
                   (pointer)in_stack_ffffffffffffdcf0,(unsigned_long)in_stack_ffffffffffffdce8);
        in_stack_ffffffffffffdce8 = (char *)0x0;
        boost::test_tools::tt_detail::report_assertion
                  (local_1610,local_1630,local_1650,0x141,CHECK,CHECK_PRED);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                    *)in_stack_ffffffffffffdce8);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_ffffffffffffdce8);
        bVar1 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar1);
      ppVar4 = std::optional<std::pair<XOnlyPubKey,_bool>_>::operator->
                         ((optional<std::pair<XOnlyPubKey,_bool>_> *)in_stack_ffffffffffffdce8);
      tweaked_key.m_keydata.super_base_blob<256U>.m_data._M_elems._0_8_ =
           *(undefined8 *)(ppVar4->first).m_keydata.super_base_blob<256U>.m_data._M_elems;
      tweaked_key.m_keydata.super_base_blob<256U>.m_data._M_elems._8_8_ =
           *(undefined8 *)((ppVar4->first).m_keydata.super_base_blob<256U>.m_data._M_elems + 8);
      tweaked_key.m_keydata.super_base_blob<256U>.m_data._M_elems._16_8_ =
           *(undefined8 *)((ppVar4->first).m_keydata.super_base_blob<256U>.m_data._M_elems + 0x10);
      tweaked_key.m_keydata.super_base_blob<256U>.m_data._M_elems._24_8_ =
           *(undefined8 *)((ppVar4->first).m_keydata.super_base_blob<256U>.m_data._M_elems + 0x18);
      RandomMixin<FastRandomContext>::rand256
                ((RandomMixin<FastRandomContext> *)in_stack_ffffffffffffdd18._M_current);
      Span<unsigned_char>::Span<64>
                ((Span<unsigned_char> *)in_stack_ffffffffffffdce8,(uchar (*) [64])0x6e4e26);
      sig_01.m_size._0_6_ = in_stack_ffffffffffffdd48;
      sig_01.m_data = (uchar *)in_stack_ffffffffffffdd40;
      sig_01.m_size._6_1_ = in_stack_ffffffffffffdd4e;
      sig_01.m_size._7_1_ = in_stack_ffffffffffffdd4f;
      CKey::SignSchnorr((CKey *)in_stack_ffffffffffffdd18._M_current,
                        (uint256 *)CONCAT17(in_stack_ffffffffffffdd17,in_stack_ffffffffffffdd10),
                        sig_01,(uint256 *)in_stack_ffffffffffffdd08._M_extent_value,
                        (uint256 *)CONCAT17(in_stack_ffffffffffffdd07,in_stack_ffffffffffffdd00));
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffdcf8,
                   (pointer)in_stack_ffffffffffffdcf0,(unsigned_long)in_stack_ffffffffffffdce8);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffdce8);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)in_stack_ffffffffffffdd28,
                   (const_string *)CONCAT17(in_stack_ffffffffffffdd27,in_stack_ffffffffffffdd20),
                   (size_t)in_stack_ffffffffffffdd18._M_current,
                   (const_string *)CONCAT17(in_stack_ffffffffffffdd17,in_stack_ffffffffffffdd10));
        boost::test_tools::assertion_result::assertion_result
                  ((assertion_result *)in_stack_ffffffffffffdcf8,
                   SUB81((ulong)in_stack_ffffffffffffdcf0 >> 0x38,0));
        boost::unit_test::lazy_ostream::instance();
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffdcf8,
                   (pointer)in_stack_ffffffffffffdcf0,(unsigned_long)in_stack_ffffffffffffdce8);
        boost::unit_test::operator<<
                  (in_stack_ffffffffffffdcf0,(basic_cstring<const_char> *)in_stack_ffffffffffffdce8)
        ;
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffdcf8,
                   (pointer)in_stack_ffffffffffffdcf0,(unsigned_long)in_stack_ffffffffffffdce8);
        in_stack_ffffffffffffdce8 = (char *)0x0;
        boost::test_tools::tt_detail::report_assertion
                  (local_1698,local_16b8,local_16d8,0x145,CHECK,CHECK_PRED);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                    *)in_stack_ffffffffffffdce8);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_ffffffffffffdce8);
        in_stack_ffffffffffffdd6f = boost::test_tools::tt_detail::dummy_cond();
      } while ((bool)in_stack_ffffffffffffdd6f);
      do {
        in_stack_ffffffffffffdd60 = boost::unit_test::(anonymous_namespace)::unit_test_log;
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffdcf8,
                   (pointer)in_stack_ffffffffffffdcf0,(unsigned_long)in_stack_ffffffffffffdce8);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffdce8);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)in_stack_ffffffffffffdd28,
                   (const_string *)CONCAT17(in_stack_ffffffffffffdd27,in_stack_ffffffffffffdd20),
                   (size_t)in_stack_ffffffffffffdd18._M_current,
                   (const_string *)CONCAT17(in_stack_ffffffffffffdd17,in_stack_ffffffffffffdd10));
        Span<const_unsigned_char>::Span<64>
                  ((Span<const_unsigned_char> *)in_stack_ffffffffffffdce8,(uchar (*) [64])0x6e5030);
        sigbytes_02.m_data._7_1_ = in_stack_ffffffffffffdd27;
        sigbytes_02.m_data._0_7_ = in_stack_ffffffffffffdd20;
        sigbytes_02.m_size = (size_t)in_stack_ffffffffffffdd28;
        in_stack_ffffffffffffdd5f =
             XOnlyPubKey::VerifySchnorr
                       ((XOnlyPubKey *)CONCAT17(in_stack_ffffffffffffdd17,in_stack_ffffffffffffdd10)
                        ,(uint256 *)in_stack_ffffffffffffdd08._M_extent_value,sigbytes_02);
        boost::test_tools::assertion_result::assertion_result
                  ((assertion_result *)in_stack_ffffffffffffdcf8,
                   SUB81((ulong)in_stack_ffffffffffffdcf0 >> 0x38,0));
        in_stack_ffffffffffffdd50 = boost::unit_test::lazy_ostream::instance();
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffdcf8,
                   (pointer)in_stack_ffffffffffffdcf0,(unsigned_long)in_stack_ffffffffffffdce8);
        boost::unit_test::operator<<
                  (in_stack_ffffffffffffdcf0,(basic_cstring<const_char> *)in_stack_ffffffffffffdce8)
        ;
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffdcf8,
                   (pointer)in_stack_ffffffffffffdcf0,(unsigned_long)in_stack_ffffffffffffdce8);
        in_stack_ffffffffffffdce8 = (char *)0x0;
        boost::test_tools::tt_detail::report_assertion
                  (local_1710,local_1740,local_1760,0x146,CHECK,CHECK_PRED);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                    *)in_stack_ffffffffffffdce8);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_ffffffffffffdce8);
        in_stack_ffffffffffffdd4f = boost::test_tools::tt_detail::dummy_cond();
      } while ((bool)in_stack_ffffffffffffdd4f);
      CKey::ComputeKeyPair((CKey *)in_stack_ffffffffffffdcf0,(uint256 *)in_stack_ffffffffffffdce8);
      Span<unsigned_char>::Span<64>
                ((Span<unsigned_char> *)in_stack_ffffffffffffdce8,(uchar (*) [64])0x6e5173);
      sig_03.m_size._0_7_ = in_stack_ffffffffffffdd68;
      sig_03.m_data = (uchar *)in_stack_ffffffffffffdd60;
      sig_03.m_size._7_1_ = in_stack_ffffffffffffdd6f;
      in_stack_ffffffffffffdd4e =
           KeyPair::SignSchnorr
                     ((KeyPair *)in_stack_ffffffffffffdd50,
                      (uint256 *)
                      CONCAT17(in_stack_ffffffffffffdd4f,
                               CONCAT16(in_stack_ffffffffffffdd4e,in_stack_ffffffffffffdd48)),sig_03
                      ,(uint256 *)in_stack_ffffffffffffdd40);
      do {
        in_stack_ffffffffffffdd40 = boost::unit_test::(anonymous_namespace)::unit_test_log;
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffdcf8,
                   (pointer)in_stack_ffffffffffffdcf0,(unsigned_long)in_stack_ffffffffffffdce8);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffdce8);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)in_stack_ffffffffffffdd28,
                   (const_string *)CONCAT17(in_stack_ffffffffffffdd27,in_stack_ffffffffffffdd20),
                   (size_t)in_stack_ffffffffffffdd18._M_current,
                   (const_string *)CONCAT17(in_stack_ffffffffffffdd17,in_stack_ffffffffffffdd10));
        boost::test_tools::assertion_result::assertion_result
                  ((assertion_result *)in_stack_ffffffffffffdcf8,
                   SUB81((ulong)in_stack_ffffffffffffdcf0 >> 0x38,0));
        in_stack_ffffffffffffdd38 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             boost::unit_test::lazy_ostream::instance();
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffdcf8,
                   (pointer)in_stack_ffffffffffffdcf0,(unsigned_long)in_stack_ffffffffffffdce8);
        boost::unit_test::operator<<
                  (in_stack_ffffffffffffdcf0,(basic_cstring<const_char> *)in_stack_ffffffffffffdce8)
        ;
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffdcf8,
                   (pointer)in_stack_ffffffffffffdcf0,(unsigned_long)in_stack_ffffffffffffdce8);
        in_stack_ffffffffffffdce8 = (char *)0x0;
        boost::test_tools::tt_detail::report_assertion
                  (local_17b0,local_17d0,local_17f0,0x14b,CHECK,CHECK_PRED);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                    *)in_stack_ffffffffffffdce8);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_ffffffffffffdce8);
        in_stack_ffffffffffffdd37 = boost::test_tools::tt_detail::dummy_cond();
      } while ((bool)in_stack_ffffffffffffdd37);
      do {
        in_stack_ffffffffffffdd28 = boost::unit_test::(anonymous_namespace)::unit_test_log;
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffdcf8,
                   (pointer)in_stack_ffffffffffffdcf0,(unsigned_long)in_stack_ffffffffffffdce8);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffdce8);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)in_stack_ffffffffffffdd28,
                   (const_string *)CONCAT17(in_stack_ffffffffffffdd27,in_stack_ffffffffffffdd20),
                   (size_t)in_stack_ffffffffffffdd18._M_current,
                   (const_string *)CONCAT17(in_stack_ffffffffffffdd17,in_stack_ffffffffffffdd10));
        Span<const_unsigned_char>::Span<64>
                  ((Span<const_unsigned_char> *)in_stack_ffffffffffffdce8,(uchar (*) [64])0x6e535d);
        sigbytes_03.m_data._7_1_ = in_stack_ffffffffffffdd27;
        sigbytes_03.m_data._0_7_ = in_stack_ffffffffffffdd20;
        sigbytes_03.m_size = (size_t)in_stack_ffffffffffffdd28;
        in_stack_ffffffffffffdd27 =
             XOnlyPubKey::VerifySchnorr
                       ((XOnlyPubKey *)CONCAT17(in_stack_ffffffffffffdd17,in_stack_ffffffffffffdd10)
                        ,(uint256 *)in_stack_ffffffffffffdd08._M_extent_value,sigbytes_03);
        boost::test_tools::assertion_result::assertion_result
                  ((assertion_result *)in_stack_ffffffffffffdcf8,
                   SUB81((ulong)in_stack_ffffffffffffdcf0 >> 0x38,0));
        in_stack_ffffffffffffdd18._M_current = (uchar *)boost::unit_test::lazy_ostream::instance();
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffdcf8,
                   (pointer)in_stack_ffffffffffffdcf0,(unsigned_long)in_stack_ffffffffffffdce8);
        boost::unit_test::operator<<
                  (in_stack_ffffffffffffdcf0,(basic_cstring<const_char> *)in_stack_ffffffffffffdce8)
        ;
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)in_stack_ffffffffffffdcf8,
                   (pointer)in_stack_ffffffffffffdcf0,(unsigned_long)in_stack_ffffffffffffdce8);
        in_stack_ffffffffffffdce8 = (char *)0x0;
        boost::test_tools::tt_detail::report_assertion
                  (local_1828,local_1858,local_1878,0x14c,CHECK,CHECK_PRED);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                    *)in_stack_ffffffffffffdce8);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_ffffffffffffdce8);
        in_stack_ffffffffffffdd17 = boost::test_tools::tt_detail::dummy_cond();
      } while ((bool)in_stack_ffffffffffffdd17);
      KeyPair::~KeyPair((KeyPair *)in_stack_ffffffffffffdce8);
    }
    KeyPair::~KeyPair((KeyPair *)in_stack_ffffffffffffdce8);
    CKey::~CKey((CKey *)in_stack_ffffffffffffdce8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffdcf8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffdcf8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffdcf8);
    __gnu_cxx::
    __normal_iterator<const_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>_*,_std::vector<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>,_std::allocator<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>_>_>_>
    ::operator++((__normal_iterator<const_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>_*,_std::vector<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>,_std::allocator<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5UL>_>_>_>
                  *)in_stack_ffffffffffffdce8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(bip340_test_vectors)
{
    static const std::vector<std::pair<std::array<std::string, 3>, bool>> VECTORS = {
        {{"F9308A019258C31049344F85F89D5229B531C845836F99B08601F113BCE036F9", "0000000000000000000000000000000000000000000000000000000000000000", "E907831F80848D1069A5371B402410364BDF1C5F8307B0084C55F1CE2DCA821525F66A4A85EA8B71E482A74F382D2CE5EBEEE8FDB2172F477DF4900D310536C0"}, true},
        {{"DFF1D77F2A671C5F36183726DB2341BE58FEAE1DA2DECED843240F7B502BA659", "243F6A8885A308D313198A2E03707344A4093822299F31D0082EFA98EC4E6C89", "6896BD60EEAE296DB48A229FF71DFE071BDE413E6D43F917DC8DCF8C78DE33418906D11AC976ABCCB20B091292BFF4EA897EFCB639EA871CFA95F6DE339E4B0A"}, true},
        {{"DD308AFEC5777E13121FA72B9CC1B7CC0139715309B086C960E18FD969774EB8", "7E2D58D8B3BCDF1ABADEC7829054F90DDA9805AAB56C77333024B9D0A508B75C", "5831AAEED7B44BB74E5EAB94BA9D4294C49BCF2A60728D8B4C200F50DD313C1BAB745879A5AD954A72C45A91C3A51D3C7ADEA98D82F8481E0E1E03674A6F3FB7"}, true},
        {{"25D1DFF95105F5253C4022F628A996AD3A0D95FBF21D468A1B33F8C160D8F517", "FFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFF", "7EB0509757E246F19449885651611CB965ECC1A187DD51B64FDA1EDC9637D5EC97582B9CB13DB3933705B32BA982AF5AF25FD78881EBB32771FC5922EFC66EA3"}, true},
        {{"D69C3509BB99E412E68B0FE8544E72837DFA30746D8BE2AA65975F29D22DC7B9", "4DF3C3F68FCC83B27E9D42C90431A72499F17875C81A599B566C9889B9696703", "00000000000000000000003B78CE563F89A0ED9414F5AA28AD0D96D6795F9C6376AFB1548AF603B3EB45C9F8207DEE1060CB71C04E80F593060B07D28308D7F4"}, true},
        {{"EEFDEA4CDB677750A420FEE807EACF21EB9898AE79B9768766E4FAA04A2D4A34", "243F6A8885A308D313198A2E03707344A4093822299F31D0082EFA98EC4E6C89", "6CFF5C3BA86C69EA4B7376F31A9BCB4F74C1976089B2D9963DA2E5543E17776969E89B4C5564D00349106B8497785DD7D1D713A8AE82B32FA79D5F7FC407D39B"}, false},
        {{"DFF1D77F2A671C5F36183726DB2341BE58FEAE1DA2DECED843240F7B502BA659", "243F6A8885A308D313198A2E03707344A4093822299F31D0082EFA98EC4E6C89", "FFF97BD5755EEEA420453A14355235D382F6472F8568A18B2F057A14602975563CC27944640AC607CD107AE10923D9EF7A73C643E166BE5EBEAFA34B1AC553E2"}, false},
        {{"DFF1D77F2A671C5F36183726DB2341BE58FEAE1DA2DECED843240F7B502BA659", "243F6A8885A308D313198A2E03707344A4093822299F31D0082EFA98EC4E6C89", "1FA62E331EDBC21C394792D2AB1100A7B432B013DF3F6FF4F99FCB33E0E1515F28890B3EDB6E7189B630448B515CE4F8622A954CFE545735AAEA5134FCCDB2BD"}, false},
        {{"DFF1D77F2A671C5F36183726DB2341BE58FEAE1DA2DECED843240F7B502BA659", "243F6A8885A308D313198A2E03707344A4093822299F31D0082EFA98EC4E6C89", "6CFF5C3BA86C69EA4B7376F31A9BCB4F74C1976089B2D9963DA2E5543E177769961764B3AA9B2FFCB6EF947B6887A226E8D7C93E00C5ED0C1834FF0D0C2E6DA6"}, false},
        {{"DFF1D77F2A671C5F36183726DB2341BE58FEAE1DA2DECED843240F7B502BA659", "243F6A8885A308D313198A2E03707344A4093822299F31D0082EFA98EC4E6C89", "0000000000000000000000000000000000000000000000000000000000000000123DDA8328AF9C23A94C1FEECFD123BA4FB73476F0D594DCB65C6425BD186051"}, false},
        {{"DFF1D77F2A671C5F36183726DB2341BE58FEAE1DA2DECED843240F7B502BA659", "243F6A8885A308D313198A2E03707344A4093822299F31D0082EFA98EC4E6C89", "00000000000000000000000000000000000000000000000000000000000000017615FBAF5AE28864013C099742DEADB4DBA87F11AC6754F93780D5A1837CF197"}, false},
        {{"DFF1D77F2A671C5F36183726DB2341BE58FEAE1DA2DECED843240F7B502BA659", "243F6A8885A308D313198A2E03707344A4093822299F31D0082EFA98EC4E6C89", "4A298DACAE57395A15D0795DDBFD1DCB564DA82B0F269BC70A74F8220429BA1D69E89B4C5564D00349106B8497785DD7D1D713A8AE82B32FA79D5F7FC407D39B"}, false},
        {{"DFF1D77F2A671C5F36183726DB2341BE58FEAE1DA2DECED843240F7B502BA659", "243F6A8885A308D313198A2E03707344A4093822299F31D0082EFA98EC4E6C89", "FFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFEFFFFFC2F69E89B4C5564D00349106B8497785DD7D1D713A8AE82B32FA79D5F7FC407D39B"}, false},
        {{"DFF1D77F2A671C5F36183726DB2341BE58FEAE1DA2DECED843240F7B502BA659", "243F6A8885A308D313198A2E03707344A4093822299F31D0082EFA98EC4E6C89", "6CFF5C3BA86C69EA4B7376F31A9BCB4F74C1976089B2D9963DA2E5543E177769FFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFEBAAEDCE6AF48A03BBFD25E8CD0364141"}, false},
        {{"FFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFEFFFFFC30", "243F6A8885A308D313198A2E03707344A4093822299F31D0082EFA98EC4E6C89", "6CFF5C3BA86C69EA4B7376F31A9BCB4F74C1976089B2D9963DA2E5543E17776969E89B4C5564D00349106B8497785DD7D1D713A8AE82B32FA79D5F7FC407D39B"}, false}
    };

    for (const auto& test : VECTORS) {
        auto pubkey = ParseHex(test.first[0]);
        auto msg = ParseHex(test.first[1]);
        auto sig = ParseHex(test.first[2]);
        BOOST_CHECK_EQUAL(XOnlyPubKey(pubkey).VerifySchnorr(uint256(msg), sig), test.second);
    }

    static const std::vector<std::array<std::string, 5>> SIGN_VECTORS = {
        {{"0000000000000000000000000000000000000000000000000000000000000003", "F9308A019258C31049344F85F89D5229B531C845836F99B08601F113BCE036F9", "0000000000000000000000000000000000000000000000000000000000000000", "0000000000000000000000000000000000000000000000000000000000000000", "E907831F80848D1069A5371B402410364BDF1C5F8307B0084C55F1CE2DCA821525F66A4A85EA8B71E482A74F382D2CE5EBEEE8FDB2172F477DF4900D310536C0"}},
        {{"B7E151628AED2A6ABF7158809CF4F3C762E7160F38B4DA56A784D9045190CFEF", "DFF1D77F2A671C5F36183726DB2341BE58FEAE1DA2DECED843240F7B502BA659", "0000000000000000000000000000000000000000000000000000000000000001", "243F6A8885A308D313198A2E03707344A4093822299F31D0082EFA98EC4E6C89", "6896BD60EEAE296DB48A229FF71DFE071BDE413E6D43F917DC8DCF8C78DE33418906D11AC976ABCCB20B091292BFF4EA897EFCB639EA871CFA95F6DE339E4B0A"}},
        {{"C90FDAA22168C234C4C6628B80DC1CD129024E088A67CC74020BBEA63B14E5C9", "DD308AFEC5777E13121FA72B9CC1B7CC0139715309B086C960E18FD969774EB8", "C87AA53824B4D7AE2EB035A2B5BBBCCC080E76CDC6D1692C4B0B62D798E6D906", "7E2D58D8B3BCDF1ABADEC7829054F90DDA9805AAB56C77333024B9D0A508B75C", "5831AAEED7B44BB74E5EAB94BA9D4294C49BCF2A60728D8B4C200F50DD313C1BAB745879A5AD954A72C45A91C3A51D3C7ADEA98D82F8481E0E1E03674A6F3FB7"}},
        {{"0B432B2677937381AEF05BB02A66ECD012773062CF3FA2549E44F58ED2401710", "25D1DFF95105F5253C4022F628A996AD3A0D95FBF21D468A1B33F8C160D8F517", "FFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFF", "FFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFF", "7EB0509757E246F19449885651611CB965ECC1A187DD51B64FDA1EDC9637D5EC97582B9CB13DB3933705B32BA982AF5AF25FD78881EBB32771FC5922EFC66EA3"}},
    };

    for (const auto& [sec_hex, pub_hex, aux_hex, msg_hex, sig_hex] : SIGN_VECTORS) {
        auto sec = ParseHex(sec_hex);
        auto pub = ParseHex(pub_hex);
        uint256 aux256(ParseHex(aux_hex));
        uint256 msg256(ParseHex(msg_hex));
        auto sig = ParseHex(sig_hex);
        unsigned char sig64[64];

        // Run the untweaked test vectors above, comparing with exact expected signature.
        CKey key;
        key.Set(sec.begin(), sec.end(), true);
        XOnlyPubKey pubkey(key.GetPubKey());
        BOOST_CHECK(std::equal(pubkey.begin(), pubkey.end(), pub.begin(), pub.end()));
        bool ok = key.SignSchnorr(msg256, sig64, nullptr, aux256);
        BOOST_CHECK(ok);
        BOOST_CHECK(std::vector<unsigned char>(sig64, sig64 + 64) == sig);
        // Verify those signatures for good measure.
        BOOST_CHECK(pubkey.VerifySchnorr(msg256, sig64));

        // Repeat the same check, but use the KeyPair directly without any merkle tweak
        KeyPair keypair = key.ComputeKeyPair(/*merkle_root=*/nullptr);
        bool kp_ok = keypair.SignSchnorr(msg256, sig64, aux256);
        BOOST_CHECK(kp_ok);
        BOOST_CHECK(pubkey.VerifySchnorr(msg256, sig64));
        BOOST_CHECK(std::vector<unsigned char>(sig64, sig64 + 64) == sig);

        // Do 10 iterations where we sign with a random Merkle root to tweak,
        // and compare against the resulting tweaked keys, with random aux.
        // In iteration i=0 we tweak with empty Merkle tree.
        for (int i = 0; i < 10; ++i) {
            uint256 merkle_root;
            if (i) merkle_root = m_rng.rand256();
            auto tweaked = pubkey.CreateTapTweak(i ? &merkle_root : nullptr);
            BOOST_CHECK(tweaked);
            XOnlyPubKey tweaked_key = tweaked->first;
            aux256 = m_rng.rand256();
            bool ok = key.SignSchnorr(msg256, sig64, &merkle_root, aux256);
            BOOST_CHECK(ok);
            BOOST_CHECK(tweaked_key.VerifySchnorr(msg256, sig64));

            // Repeat the same check, but use the KeyPair class directly
            KeyPair keypair = key.ComputeKeyPair(&merkle_root);
            bool kp_ok = keypair.SignSchnorr(msg256, sig64, aux256);
            BOOST_CHECK(kp_ok);
            BOOST_CHECK(tweaked_key.VerifySchnorr(msg256, sig64));
        }
    }
}